

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O2

QWeakPointer<QObject> * __thiscall
QWeakPointer<QObject>::operator=(QWeakPointer<QObject> *this,QWeakPointer<QObject> *other)

{
  QObject *pQVar1;
  long in_FS_OFFSET;
  Data *pDVar2;
  QWeakPointer<QObject> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar2 = other->d;
  pQVar1 = other->value;
  if (pDVar2 == (Data *)0x0) {
    pDVar2 = (Data *)0x0;
  }
  else {
    LOCK();
    (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_28.d = this->d;
  local_28.value = this->value;
  this->d = pDVar2;
  this->value = pQVar1;
  ~QWeakPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return this;
}

Assistant:

QWeakPointer &operator=(const QWeakPointer &other) noexcept
    {
        QWeakPointer copy(other);
        swap(copy);
        return *this;
    }